

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O2

bool sptk::MakePseudoQuadratureMirrorFilterBanks
               (bool inverse,int num_subband,int num_filter_order,double attenuation,
               int num_iteration,double convergence_threshold,double initial_step_size,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *filter_banks,bool *is_converged)

{
  pointer pdVar1;
  bool bVar2;
  int iVar3;
  int n;
  ulong uVar4;
  long lVar5;
  int n_1;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> real;
  vector<double,_std::allocator<double>_> ideal_filter;
  vector<double,_std::allocator<double>_> prototype_filter;
  vector<double,_std::allocator<double>_> imag;
  Buffer buffer_for_fft;
  KaiserWindow kaiser_window;
  RealValuedFastFourierTransform fft;
  double local_1b8;
  double local_198;
  _Vector_base<double,_std::allocator<double>_> local_188;
  bool *local_168;
  double local_160;
  _Vector_base<double,_std::allocator<double>_> local_158;
  _Vector_base<double,_std::allocator<double>_> local_140;
  _Vector_base<double,_std::allocator<double>_> local_128;
  Buffer local_108;
  KaiserWindow local_d0;
  RealValuedFastFourierTransform local_98;
  ulong __n;
  
  if ((filter_banks !=
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)0x0 && 0.0 < initial_step_size) &&
      (0.0 <= convergence_threshold &&
      ((num_iteration != 0 && (1 < num_filter_order && num_subband != 0)) && 0.0 < attenuation))) {
    if (is_converged != (bool *)0x0) {
      *is_converged = false;
    }
    uVar9 = num_filter_order + 1;
    __n = (ulong)uVar9;
    local_160 = convergence_threshold;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_140,__n,(allocator_type *)&local_98
              );
    dVar11 = KaiserWindow::AttenuationToBeta(attenuation);
    KaiserWindow::KaiserWindow(&local_d0,uVar9,dVar11,false);
    iVar3 = NextPowTwo(uVar9);
    local_168 = is_converged;
    RealValuedFastFourierTransform::RealValuedFastFourierTransform(&local_98,num_filter_order,iVar3)
    ;
    local_108._vptr_Buffer = (_func_int **)&PTR__Buffer_00118c70;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_98.is_valid_ == false) {
      bVar10 = false;
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_158,__n,
                 (allocator_type *)&local_188);
      local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar3 = iVar3 / (num_subband * 4);
      local_1b8 = 3.141592653589793 / (double)(num_subband * 2);
      iVar7 = 0;
      if (num_iteration < 1) {
        num_iteration = 0;
      }
      dVar11 = 1.79769313486232e+308;
      local_198 = initial_step_size;
      while( true ) {
        pdVar1 = local_158._M_impl.super__Vector_impl_data._M_start;
        bVar10 = iVar7 == num_iteration;
        if (bVar10) break;
        for (uVar4 = 0; uVar4 <= (uint)num_filter_order; uVar4 = uVar4 + 1) {
          dVar13 = (double)(int)uVar4 + (double)num_filter_order * -0.5;
          dVar12 = sin(local_1b8 * dVar13);
          pdVar1[uVar4] = dVar12 / (dVar13 * 3.141592653589793);
        }
        bVar2 = IsEven(uVar9);
        if (!bVar2) {
          pdVar1[(uint)num_filter_order >> 1] = local_1b8 / 3.141592653589793;
        }
        for (lVar5 = 0;
            (double *)((long)local_158._M_impl.super__Vector_impl_data._M_start + lVar5) !=
            local_158._M_impl.super__Vector_impl_data._M_finish; lVar5 = lVar5 + 8) {
          *(double *)((long)local_140._M_impl.super__Vector_impl_data._M_start + lVar5) =
               *(double *)((long)local_158._M_impl.super__Vector_impl_data._M_start + lVar5) *
               *(double *)
                ((long)local_d0.window_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar5);
        }
        bVar2 = RealValuedFastFourierTransform::Run
                          (&local_98,(vector<double,_std::allocator<double>_> *)&local_140,
                           (vector<double,_std::allocator<double>_> *)&local_188,
                           (vector<double,_std::allocator<double>_> *)&local_128,&local_108);
        if (!bVar2) goto LAB_0010a1fd;
        dVar13 = local_188._M_impl.super__Vector_impl_data._M_start[iVar3] *
                 local_188._M_impl.super__Vector_impl_data._M_start[iVar3] +
                 local_128._M_impl.super__Vector_impl_data._M_start[iVar3] *
                 local_128._M_impl.super__Vector_impl_data._M_start[iVar3] + -0.5;
        dVar12 = ABS(dVar13);
        if (dVar12 < local_160) {
          if (local_168 != (bool *)0x0) {
            *local_168 = true;
          }
          break;
        }
        local_198 = (double)((ulong)local_198 & -(ulong)(dVar12 < dVar11) |
                            ~-(ulong)(dVar12 < dVar11) & (ulong)(local_198 * 0.5));
        if (dVar11 <= dVar12) {
          dVar12 = dVar11;
        }
        local_1b8 = local_1b8 + local_198 * *(double *)(&DAT_00111c90 + (ulong)(0.0 < dVar13) * 8);
        iVar7 = iVar7 + 1;
        dVar11 = dVar12;
      }
      bVar10 = true;
LAB_0010a1fd:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_128);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_188);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_158);
    }
    RealValuedFastFourierTransform::Buffer::~Buffer(&local_108);
    RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&local_98);
    KaiserWindow::~KaiserWindow(&local_d0);
    if (bVar10 != false) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(filter_banks,(long)num_subband);
      uVar9 = -(uint)inverse | 1;
      uVar8 = 0;
      uVar4 = (ulong)(uint)num_subband;
      if (num_subband < 1) {
        uVar4 = uVar8;
      }
      for (; uVar8 != uVar4; uVar8 = uVar8 + 1) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((filter_banks->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
        pdVar1 = local_140._M_impl.super__Vector_impl_data._M_start;
        lVar5 = *(long *)&(filter_banks->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        for (uVar6 = 0; uVar6 <= (uint)num_filter_order; uVar6 = uVar6 + 1) {
          dVar11 = pdVar1[uVar6];
          dVar12 = cos(((double)(int)uVar6 + (double)num_filter_order * -0.5) *
                       (((double)((int)uVar8 * 2 + 1) * 3.141592653589793) /
                       (double)(num_subband * 2)) + (double)(int)uVar9 * 0.25 * 3.141592653589793);
          *(double *)(lVar5 + uVar6 * 8) = dVar12 * (dVar11 + dVar11);
        }
        uVar9 = -uVar9;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_140);
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool MakePseudoQuadratureMirrorFilterBanks(
    bool inverse, int num_subband, int num_filter_order, double attenuation,
    int num_iteration, double convergence_threshold, double initial_step_size,
    std::vector<std::vector<double> >* filter_banks, bool* is_converged) {
  if (0 == num_subband || num_filter_order <= 1 || attenuation <= 0.0 ||
      0 == num_iteration || convergence_threshold < 0.0 ||
      initial_step_size <= 0.0 || NULL == filter_banks) {
    return false;
  }

  if (is_converged) *is_converged = false;

  // Design prototype filter.
  const int filter_size(num_filter_order + 1);
  std::vector<double> prototype_filter(filter_size);
  {
    // Make Kaiser window.
    const sptk::KaiserWindow kaiser_window(
        filter_size, sptk::KaiserWindow::AttenuationToBeta(attenuation), false);
    const std::vector<double>& window(kaiser_window.Get());

    // Prepare FFT.
    const int fft_size(sptk::NextPowTwo(filter_size));
    sptk::RealValuedFastFourierTransform fft(num_filter_order, fft_size);
    sptk::RealValuedFastFourierTransform::Buffer buffer_for_fft;
    if (!fft.IsValid()) {
      return false;
    }

    std::vector<double> ideal_filter(filter_size);
    std::vector<double> real;
    std::vector<double> imag;
    const int index(fft_size / (4 * num_subband));

    // Initialize.
    double omega(sptk::kPi / (2 * num_subband));
    double step_size(initial_step_size);
    double best_abs_error(sptk::kMax);

    for (int i(0); i < num_iteration; ++i) {
      // Make ideal filter.
      {
        double* h(&(ideal_filter[0]));
        for (int n(0); n < filter_size; ++n) {
          const double x(n - 0.5 * num_filter_order);
          h[n] = std::sin(omega * x) / (sptk::kPi * x);
        }
        // Avoid NaN using L'Hopital's rule.
        if (!sptk::IsEven(filter_size))
          h[num_filter_order / 2] = omega / sptk::kPi;
      }

      // Make prototype filter.
      std::transform(ideal_filter.begin(), ideal_filter.end(), window.begin(),
                     prototype_filter.begin(),
                     [](double h, double w) { return h * w; });

      // Get frequency response of the prototype filter.
      if (!fft.Run(prototype_filter, &real, &imag, &buffer_for_fft)) {
        return false;
      }

      // Calculate error.
      const double error(real[index] * real[index] + imag[index] * imag[index] -
                         0.5);
      const double abs_error(std::fabs(error));
      if (abs_error < convergence_threshold) {
        if (is_converged) *is_converged = true;
        break;
      }

      // Update angular frequency.
      const int sign((0 < error) ? -1 : 1);
      if (abs_error < best_abs_error) {
        omega += sign * step_size;
        best_abs_error = abs_error;
      } else {
        step_size *= 0.5;  // Drop step size by half (heuristic).
        omega += sign * step_size;
      }
    }
  }

  // Make filter banks.
  {
    filter_banks->resize(num_subband);
    int sign(inverse ? -1 : 1);
    for (int k(0); k < num_subband; ++k) {
      (*filter_banks)[k].resize(filter_size);
      const double* p(&(prototype_filter[0]));
      double* h(&((*filter_banks)[k][0]));
      for (int n(0); n < filter_size; ++n) {
        const double a((2 * k + 1) * sptk::kPi / (2 * num_subband) *
                       (n - 0.5 * num_filter_order));
        const double b(sign * 0.25 * sptk::kPi);
        const double c(2.0 * p[n]);
        h[n] = c * std::cos(a + b);
      }
      sign *= -1;
    }
  }
  return true;
}